

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::DOMAttrMapImpl::findNamePoint
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  undefined4 extraout_var_01;
  XMLCh *pXVar7;
  ulong uVar8;
  DOMNode *pDVar9;
  XMLCh *pXVar5;
  undefined4 extraout_var_00;
  
  if ((this->fNodes != (DOMNodeVector *)0x0) && (uVar3 = this->fNodes->nextFreeSlot, uVar3 != 0)) {
    uVar8 = 0;
    do {
      if (uVar8 < this->fNodes->nextFreeSlot) {
        pDVar9 = this->fNodes->data[uVar8];
      }
      else {
        pDVar9 = (DOMNode *)0x0;
      }
      iVar4 = (*pDVar9->_vptr_DOMNode[0x16])(pDVar9);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
      iVar4 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
      if (pXVar5 == namespaceURI) {
LAB_0025b2d6:
        if (pXVar6 == localName) goto LAB_0025b3bf;
        pXVar5 = pXVar6;
        if ((localName == (XMLCh *)0x0) || (pXVar7 = localName, pXVar6 == (XMLCh *)0x0)) {
          if (localName == (XMLCh *)0x0) {
            if (pXVar6 == (XMLCh *)0x0) goto LAB_0025b3bf;
LAB_0025b33d:
            XVar1 = *pXVar5;
          }
          else {
            XVar1 = *localName;
            if (XVar1 == L'\0' && pXVar6 != (XMLCh *)0x0) goto LAB_0025b33d;
          }
          if (XVar1 == L'\0') goto LAB_0025b3bf;
        }
        else {
          do {
            XVar1 = *pXVar7;
            if (XVar1 == L'\0') goto LAB_0025b33d;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar7 = pXVar7 + 1;
          } while (XVar1 == XVar2);
        }
        if (pXVar6 == (XMLCh *)0x0) {
          iVar4 = (*pDVar9->_vptr_DOMNode[2])(pDVar9);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
          if (pXVar5 == localName) goto LAB_0025b3bf;
          if ((localName != (XMLCh *)0x0) && (pXVar6 = localName, pXVar5 != (XMLCh *)0x0)) {
            do {
              XVar1 = *pXVar6;
              if (XVar1 == L'\0') goto LAB_0025b3a5;
              XVar2 = *pXVar5;
              pXVar5 = pXVar5 + 1;
              pXVar6 = pXVar6 + 1;
            } while (XVar1 == XVar2);
            goto LAB_0025b3ab;
          }
          if (localName == (XMLCh *)0x0) {
            if (pXVar5 == (XMLCh *)0x0) goto LAB_0025b3bf;
LAB_0025b3a5:
            XVar1 = *pXVar5;
          }
          else {
            XVar1 = *localName;
            if (XVar1 == L'\0' && pXVar5 != (XMLCh *)0x0) goto LAB_0025b3a5;
          }
          if (XVar1 == L'\0') {
LAB_0025b3bf:
            return (int)uVar8;
          }
        }
      }
      else {
        pXVar7 = namespaceURI;
        if ((namespaceURI == (XMLCh *)0x0) || (pXVar5 == (XMLCh *)0x0)) {
          if (pXVar5 == (XMLCh *)0x0) {
            if (namespaceURI == (XMLCh *)0x0) goto LAB_0025b2d6;
LAB_0025b2cc:
            XVar1 = *pXVar7;
          }
          else {
            XVar1 = *pXVar5;
            if ((namespaceURI != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_0025b2cc;
          }
          if (XVar1 == L'\0') goto LAB_0025b2d6;
        }
        else {
          do {
            XVar1 = *pXVar5;
            if (XVar1 == L'\0') goto LAB_0025b2cc;
            pXVar5 = pXVar5 + 1;
            XVar2 = *pXVar7;
            pXVar7 = pXVar7 + 1;
          } while (XVar1 == XVar2);
        }
      }
LAB_0025b3ab:
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  return -1;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *namespaceURI,
	const XMLCh *localName) const
{
    if (fNodes == 0)
	return -1;
    // This is a linear search through the same fNodes Vector.
    // The Vector is sorted on the DOM Level 1 nodename.
    // The DOM Level 2 NS keys are namespaceURI and Localname,
    // so we must linear search thru it.
    // In addition, to get this to work with fNodes without any namespace
    // (namespaceURI and localNames are both 0) we then use the nodeName
    // as a secondary key.
    const XMLSize_t len = fNodes -> size();
    for (XMLSize_t i = 0; i < len; ++i) {
        DOMNode *node = fNodes -> elementAt(i);
        const XMLCh * nNamespaceURI = node->getNamespaceURI();
        const XMLCh * nLocalName = node->getLocalName();
        if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
            continue;
        else {
            if (XMLString::equals(localName, nLocalName)
                ||
                (nLocalName == 0 && XMLString::equals(localName, node->getNodeName())))
                return (int)i;
        }
    }
    return -1;	//not found
}